

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  mapped_type *pmVar2;
  undefined1 local_2e0 [8];
  ShellOptions options;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> skipped;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [2];
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::SExpressionWasmBuilder>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::SExpressionWasmBuilder>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::SExpressionWasmBuilder>_>_>_>
  local_170;
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>_>_>
  local_140;
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  local_110;
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  local_e0;
  undefined1 local_98 [8];
  SExpressionParser parser;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  MixedArena local_78;
  Element *local_48;
  char *local_40;
  vector<char,_std::allocator<char>_> input;
  
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&skipped;
  skipped._M_t._M_impl._0_4_ = 0;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  skipped._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,"wasm-shell","");
  local_98 = (undefined1  [8])&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Execute .wast files","");
  ShellOptions::ShellOptions
            ((ShellOptions *)local_2e0,
             (string *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,(string *)local_98)
  ;
  if (local_98 != (undefined1  [8])&local_88) {
    operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)skipped._M_t._M_impl.super__Rb_tree_header._M_node_count != local_190) {
    operator_delete((void *)skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    local_190[0]._M_allocated_capacity + 1);
  }
  wasm::Options::parse((int)local_2e0,(char **)(ulong)(uint)argc);
  skipped._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,"infile","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options,
                        (key_type *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count);
  wasm::read_file<std::vector<char,std::allocator<char>>>((string *)&local_40,(BinaryOption)pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)skipped._M_t._M_impl.super__Rb_tree_header._M_node_count != local_190) {
    operator_delete((void *)skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    local_190[0]._M_allocated_capacity + 1);
  }
  if (local_2e0[0] == (Options)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"parsing text to s-expressions...\n",0x21);
  }
  wasm::SExpressionParser::SExpressionParser((SExpressionParser *)local_98,local_40);
  Shell::Shell((Shell *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (ShellOptions *)local_2e0);
  bVar1 = Shell::parseAndRun((Shell *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             local_48);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::~_Rb_tree(&local_e0);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::~_Rb_tree(&local_110);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>_>_>
  ::~_Rb_tree(&local_140);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::SExpressionWasmBuilder>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::SExpressionWasmBuilder>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::SExpressionWasmBuilder>_>_>_>
  ::~_Rb_tree(&local_170);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>_>_>
               *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MixedArena::~MixedArena(&local_78);
  if (bVar1) {
    Colors::outputColorCode((ostream *)&std::cerr,"\x1b[32m");
    Colors::outputColorCode((ostream *)&std::cerr,"\x1b[1m");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"all checks passed.\n",0x13);
    Colors::outputColorCode((ostream *)&std::cerr,"\x1b[0m");
  }
  if (local_40 != (char *)0x0) {
    operator_delete(local_40,(long)input.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)local_40);
  }
  if ((size_type *)options.skipped._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      &options.WasmShellOption._M_string_length) {
    operator_delete((void *)options.skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    options.WasmShellOption._M_string_length + 1);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)&options.entry.super_IString.str._M_str);
  wasm::Options::~Options((Options *)local_2e0);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)((long)&options.WasmShellOption.field_2 + 8));
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  Name entry;
  std::set<size_t> skipped;

  ShellOptions options("wasm-shell", "Execute .wast files");
  options.parse(argc, argv);

  auto input(
    read_file<std::vector<char>>(options.extra["infile"], Flags::Text));

  bool checked = false;
  try {
    if (options.debug) {
      std::cerr << "parsing text to s-expressions...\n";
    }
    SExpressionParser parser(input.data());
    Element& root = *parser.root;
    checked = Shell(options).parseAndRun(root);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    exit(1);
  }

  if (checked) {
    Colors::green(std::cerr);
    Colors::bold(std::cerr);
    std::cerr << "all checks passed.\n";
    Colors::normal(std::cerr);
  }
}